

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamtests.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_525a::ktxStreamTest_CanCreateKtx2FromCppStream_Test::
~ktxStreamTest_CanCreateKtx2FromCppStream_Test(ktxStreamTest_CanCreateKtx2FromCppStream_Test *this)

{
  basic_streambuf<char,_std::char_traits<char>_> *pbVar1;
  
  (this->super_ktxStreamTest).super_Test._vptr_Test = (_func_int **)&PTR__ktxStreamTest_00152ab0;
  pbVar1 = (this->super_ktxStreamTest)._ktx2Streambuf._M_t.
           super___uniq_ptr_impl<std::basic_streambuf<char,_std::char_traits<char>_>,_std::default_delete<std::basic_streambuf<char,_std::char_traits<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_streambuf<char,_std::char_traits<char>_>_>_>
           .super__Head_base<0UL,_std::basic_streambuf<char,_std::char_traits<char>_>_*,_false>.
           _M_head_impl;
  if (pbVar1 != (basic_streambuf<char,_std::char_traits<char>_> *)0x0) {
    (**(code **)(*(long *)pbVar1 + 8))();
  }
  (this->super_ktxStreamTest)._ktx2Streambuf._M_t.
  super___uniq_ptr_impl<std::basic_streambuf<char,_std::char_traits<char>_>,_std::default_delete<std::basic_streambuf<char,_std::char_traits<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_streambuf<char,_std::char_traits<char>_>_>_>
  .super__Head_base<0UL,_std::basic_streambuf<char,_std::char_traits<char>_>_*,_false>._M_head_impl
       = (basic_streambuf<char,_std::char_traits<char>_> *)0x0;
  pbVar1 = (this->super_ktxStreamTest)._ktx1Streambuf._M_t.
           super___uniq_ptr_impl<std::basic_streambuf<char,_std::char_traits<char>_>,_std::default_delete<std::basic_streambuf<char,_std::char_traits<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_streambuf<char,_std::char_traits<char>_>_>_>
           .super__Head_base<0UL,_std::basic_streambuf<char,_std::char_traits<char>_>_*,_false>.
           _M_head_impl;
  if (pbVar1 != (basic_streambuf<char,_std::char_traits<char>_> *)0x0) {
    (**(code **)(*(long *)pbVar1 + 8))();
  }
  (this->super_ktxStreamTest)._ktx1Streambuf._M_t.
  super___uniq_ptr_impl<std::basic_streambuf<char,_std::char_traits<char>_>,_std::default_delete<std::basic_streambuf<char,_std::char_traits<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_streambuf<char,_std::char_traits<char>_>_>_>
  .super__Head_base<0UL,_std::basic_streambuf<char,_std::char_traits<char>_>_*,_false>._M_head_impl
       = (basic_streambuf<char,_std::char_traits<char>_> *)0x0;
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x20);
  return;
}

Assistant:

TEST_F(ktxStreamTest, CanCreateKtx2FromCppStream)
{
    StreambufStream ktx2Stream{std::move(_ktx2Streambuf), std::ios::in};
    KtxTexture<ktxTexture2> texture2;

    KTX_error_code err = ktxTexture2_CreateFromStream(ktx2Stream.stream(), KTX_TEXTURE_CREATE_LOAD_IMAGE_DATA_BIT, texture2.pHandle());
    EXPECT_EQ(err, KTX_SUCCESS) << "Failed to create KTX2 from C++ stream: " << ktxErrorString(err);
    ASSERT_NE(texture2, nullptr) << "Newly-created KTX2 is null";
    EXPECT_TRUE(ktx2Stream.destructed()) << "ktxStream should have been destructed (LOAD_IMAGE_DATA_BIT set)";
}